

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entry.c
# Opt level: O2

stumpless_element * locked_get_element_by_name(stumpless_entry *entry,char *name)

{
  stumpless_element *element;
  int iVar1;
  size_t i;
  ulong uVar2;
  
  uVar2 = 0;
  do {
    if (entry->element_count <= uVar2) {
      raise_element_not_found();
      return (stumpless_element *)0x0;
    }
    element = entry->elements[uVar2];
    lock_element(element);
    iVar1 = strcmp(element->name,name);
    unlock_element(element);
    uVar2 = uVar2 + 1;
  } while (iVar1 != 0);
  return element;
}

Assistant:

struct stumpless_element *
locked_get_element_by_name( const struct stumpless_entry *entry,
                            const char *name ) {
  size_t i;
  struct stumpless_element *element;
  int cmp_result;

  for( i = 0; i < entry->element_count; i++ ) {
    element = entry->elements[i];

    lock_element( element );
    cmp_result = strcmp( element->name, name );
    unlock_element( element );

    if( cmp_result == 0 ) {
      return element;
    }
  }

  raise_element_not_found(  );
  return NULL;
}